

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O3

bool __thiscall
spvtools::val::ValidationState_t::IsSignedIntScalarType(ValidationState_t *this,uint32_t id)

{
  long *plVar1;
  const_iterator cVar2;
  bool bVar3;
  key_type local_4;
  
  cVar2 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->all_definitions_)._M_h,&local_4);
  if (((cVar2.
        super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
        ._M_cur == (__node_type *)0x0) ||
      (plVar1 = *(long **)((long)cVar2.
                                 super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::val::Instruction_*>,_false>
                                 ._M_cur + 0x10), plVar1 == (long *)0x0)) ||
     (*(short *)((long)plVar1 + 0x3a) != 0x15)) {
    bVar3 = false;
  }
  else {
    bVar3 = *(int *)(*plVar1 + 0xc) == 1;
  }
  return bVar3;
}

Assistant:

bool ValidationState_t::IsSignedIntScalarType(uint32_t id) const {
  const Instruction* inst = FindDef(id);
  return inst && inst->opcode() == spv::Op::OpTypeInt && inst->word(3) == 1;
}